

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteConstant<float,float,float,duckdb::BinaryStandardOperatorWrapper,duckdb::NextAfterOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  float *pfVar1;
  float fVar2;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  pfVar1 = *(float **)(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    fVar2 = nextafterf(**(float **)(left + 0x20),**(float **)(right + 0x20));
    *pfVar1 = fVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}